

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_ops.cc
# Opt level: O1

Reflection * google::protobuf::internal::GetReflectionOrDie(Message *m)

{
  long *plVar1;
  long lVar2;
  int iVar3;
  undefined4 extraout_var;
  LogMessage *pLVar4;
  Reflection *extraout_RDX;
  LogFinisher local_69;
  string local_68;
  LogMessage local_48;
  
  (*(m->super_MessageLite)._vptr_MessageLite[0x15])();
  if (extraout_RDX == (Reflection *)0x0) {
    iVar3 = (*(m->super_MessageLite)._vptr_MessageLite[0x15])(m);
    if ((long *)CONCAT44(extraout_var,iVar3) == (long *)0x0) {
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"unknown","");
    }
    else {
      plVar1 = *(long **)CONCAT44(extraout_var,iVar3);
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      lVar2 = *plVar1;
      std::__cxx11::string::_M_construct<char*>((string *)&local_68,lVar2,plVar1[1] + lVar2);
    }
    LogMessage::LogMessage
              (&local_48,LOGLEVEL_FATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/reflection_ops.cc"
               ,0x3c);
    pLVar4 = LogMessage::operator<<(&local_48,"Message does not support reflection (type ");
    pLVar4 = LogMessage::operator<<(pLVar4,&local_68);
    pLVar4 = LogMessage::operator<<(pLVar4,").");
    LogFinisher::operator=(&local_69,pLVar4);
    LogMessage::~LogMessage(&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p);
    }
  }
  return extraout_RDX;
}

Assistant:

static const Reflection* GetReflectionOrDie(const Message& m) {
  const Reflection* r = m.GetReflection();
  if (r == nullptr) {
    const Descriptor* d = m.GetDescriptor();
    const std::string& mtype = d ? d->name() : "unknown";
    // RawMessage is one known type for which GetReflection() returns nullptr.
    GOOGLE_LOG(FATAL) << "Message does not support reflection (type " << mtype << ").";
  }
  return r;
}